

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_option_message.hpp
# Opt level: O1

void iutest::detail::iuOptionMessage::ShowFeature(void)

{
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_ANY_PARAM_TEST","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_ASSERTION_NOEQUALTO_OBJECT","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_ASSERTION_RETURN","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_AUTOFIXTURE_PARAM_TEST","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_COMBINE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CONCAT","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CSVPARAMS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_EXCEPTIONS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_GENRAND","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_MATCHERS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_MATCHER_ALLOF_AND_ANYOF","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_MATCHER_EACH","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_MATCHER_ELEMENTSARE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_MATCHER_FLOATINGPOINT_NEAR","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_MATCHER_OPTIONAL","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_MATCHER_POINTWISE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_MATCHER_REGEX","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_MATCHER_VARIADIC","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_PACKAGE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_PAIRWISE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_PARAM_METHOD_TEST","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_PARAM_TEST","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_PARAM_TEST_PARAM_NAME_GENERATOR","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_PEEP","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_PEEP_CLASS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_PEEP_FUNC","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_PEEP_STATIC_FUNC","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_PRINT_TO","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_RANDOMVALUES","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_REGEX","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_REPORT_SKIPPED","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_SOCKET","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_SPI_LAMBDA_SUPPORT","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STATIC_ASSERT","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STATIC_ASSERT_TYPEEQ","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STREAM_BUFFER","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STREAM_CAPTURE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STREAM_RESULT","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_TESTFIXTURE_ALIAS_BY_TUPLE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_TESTNAME_ALIAS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_TESTNAME_ALIAS_JP","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_TYPED_TEST","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_TYPED_TEST_P","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_VALUESGEN","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_VARIADIC_COMBINE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_VARIADIC_PAIRWISE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_VARIADIC_VALUES","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_IGNORE_TEST","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_LIB","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_MINIDUMP","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_TYPED_TEST_APPEND_TYPENAME","0");
  return;
}

Assistant:

inline void iuOptionMessage::ShowFeature()
{
#if 0
    IIUT_SHOW_FEATURE_MACROS(IIUT_SHOW_MACRO);
#else
    IIUT_SHOW_FEATURE_MACROS(IIUT_SHOW_ENABLE_MACRO);
    IIUT_SHOW_FEATURE_MACROS(IIUT_SHOW_DISABLE_MACRO);
#endif
}